

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneobject.cpp
# Opt level: O3

void __thiscall SceneObject::SceneObject(SceneObject *this,mat4 *ltw,ColorRGB c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  this->_vptr_SceneObject = (_func_int **)&PTR__SceneObject_0010bd58;
  ColorRGB::ColorRGB(&this->color);
  *(undefined8 *)&(this->position).field_0 = 0;
  *(undefined8 *)((long)&(this->position).field_0 + 8) = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->localToWorld).value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[0].field_0 + 0xc) = 0;
  (this->localToWorld).value[1].field_0.field_0.y = 1.0;
  *(undefined8 *)((long)&(this->localToWorld).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->localToWorld).value[2].field_0 = 0;
  (this->localToWorld).value[2].field_0.field_0.z = 1.0;
  *(undefined8 *)((long)&(this->localToWorld).value[2].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[3].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[3].field_0 + 0xc) = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->worldToLocal).value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[0].field_0 + 0xc) = 0;
  (this->worldToLocal).value[1].field_0.field_0.y = 1.0;
  *(undefined8 *)((long)&(this->worldToLocal).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->worldToLocal).value[2].field_0 = 0;
  (this->worldToLocal).value[2].field_0.field_0.z = 1.0;
  *(undefined8 *)((long)&(this->worldToLocal).value[2].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[3].field_0 + 4) = 0;
  (this->worldToLocal).value[3].field_0.field_0.w = 1.0;
  (this->localToWorld).value[0].field_0.field_0.x = ltw->value[0].field_0.field_0.x;
  (this->localToWorld).value[0].field_0.field_0.y = ltw->value[0].field_0.field_0.y;
  (this->localToWorld).value[0].field_0.field_0.z = ltw->value[0].field_0.field_0.z;
  (this->localToWorld).value[0].field_0.field_0.w = ltw->value[0].field_0.field_0.w;
  (this->localToWorld).value[1].field_0.field_0.x = ltw->value[1].field_0.field_0.x;
  (this->localToWorld).value[1].field_0.field_0.y = ltw->value[1].field_0.field_0.y;
  (this->localToWorld).value[1].field_0.field_0.z = ltw->value[1].field_0.field_0.z;
  (this->localToWorld).value[1].field_0.field_0.w = ltw->value[1].field_0.field_0.w;
  (this->localToWorld).value[2].field_0.field_0.x = ltw->value[2].field_0.field_0.x;
  (this->localToWorld).value[2].field_0.field_0.y = ltw->value[2].field_0.field_0.y;
  (this->localToWorld).value[2].field_0.field_0.z = ltw->value[2].field_0.field_0.z;
  (this->localToWorld).value[2].field_0.field_0.w = ltw->value[2].field_0.field_0.w;
  (this->localToWorld).value[3].field_0.field_0.x = ltw->value[3].field_0.field_0.x;
  (this->localToWorld).value[3].field_0.field_0.y = ltw->value[3].field_0.field_0.y;
  (this->localToWorld).value[3].field_0.field_0.z = ltw->value[3].field_0.field_0.z;
  (this->localToWorld).value[3].field_0.field_0.w = ltw->value[3].field_0.field_0.w;
  glm::inverse<float>(ltw);
  *(undefined8 *)&(this->worldToLocal).value[0].field_0 = local_58;
  *(undefined8 *)((long)&(this->worldToLocal).value[0].field_0 + 8) = uStack_50;
  *(undefined8 *)&(this->worldToLocal).value[1].field_0 = local_48;
  *(undefined8 *)((long)&(this->worldToLocal).value[1].field_0 + 8) = uStack_40;
  *(undefined8 *)&(this->worldToLocal).value[2].field_0 = local_38;
  *(undefined8 *)((long)&(this->worldToLocal).value[2].field_0 + 8) = uStack_30;
  *(undefined8 *)&(this->worldToLocal).value[3].field_0 = local_28;
  *(undefined8 *)((long)&(this->worldToLocal).value[3].field_0 + 8) = uStack_20;
  (this->color).r = (float)(int)c._0_8_;
  (this->color).g = (float)(int)((ulong)c._0_8_ >> 0x20);
  (this->color).b = c.b;
  fVar1 = ltw->value[1].field_0.field_0.z;
  fVar2 = ltw->value[0].field_0.field_0.z;
  fVar3 = ltw->value[2].field_0.field_0.z;
  fVar4 = ltw->value[3].field_0.field_0.z;
  uVar5 = *(undefined8 *)&ltw->value[0].field_0;
  uVar6 = *(undefined8 *)&ltw->value[1].field_0;
  uVar7 = *(undefined8 *)&ltw->value[2].field_0;
  uVar8 = *(undefined8 *)&ltw->value[3].field_0;
  *(ulong *)&(this->position).field_0 =
       CONCAT44((float)((ulong)uVar7 >> 0x20) * 0.0 +
                (float)((ulong)uVar5 >> 0x20) * 0.0 + (float)((ulong)uVar6 >> 0x20) * 0.0 +
                (float)((ulong)uVar8 >> 0x20),
                (float)uVar7 * 0.0 + (float)uVar5 * 0.0 + (float)uVar6 * 0.0 + (float)uVar8);
  (this->position).field_0.field_0.z = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 0.0 + fVar4;
  return;
}

Assistant:

SceneObject::SceneObject(const glm::mat4 &ltw, ColorRGB c) {
    localToWorld = ltw;
    worldToLocal = glm::inverse(ltw);
    color = c;
    
    position = glm::vec3(ltw * glm::vec4(0, 0, 0, 1)); //poor mans swizzling
}